

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  const_reference ppLVar2;
  undefined8 *in_RCX;
  vector<float,_std::allocator<float>_> *in_RDX;
  Mat *in_RSI;
  long *in_RDI;
  Option opt_g_6;
  Layer *op_5;
  Mat top_blob_g_3;
  Mat bottom_blob_bordered_g_5;
  int g_6;
  int num_output_g;
  int channels_g;
  Option opt_g_5;
  Layer *op_4;
  Mat top_blob_g_2;
  Mat bottom_blob_bordered_g_4;
  int g_5;
  Option opt_g_4;
  Layer *op_3;
  Mat top_blob_g_1;
  Mat bottom_blob_bordered_g_3;
  int g_4;
  int num_output_g_2;
  int channels_g_3;
  Option opt_g_3;
  Layer *op_2;
  Mat top_blob_g;
  Mat bottom_blob_bordered_g_2;
  int g_3;
  Option opt_g_2;
  Layer *op_1;
  Mat top_blob_tm_g_1;
  Mat bottom_blob_bordered_g_1;
  int g_2;
  int num_output_g_1;
  int channels_g_2;
  Option opt_g_1;
  Layer *op;
  Mat top_blob_tm_g;
  Mat bottom_blob_bordered_g;
  int g_1;
  Mat top_blob_tm;
  int outh;
  int outw;
  Option opt_b_2;
  int hpad_1;
  int wpad_1;
  Option opt_b_1;
  int hpad;
  int wpad;
  Option opt_b;
  Mat bottom_blob_bordered;
  Mat bottom_blob_int8_g;
  Mat bottom_blob_g;
  Option opt_g;
  int g;
  int channels_g_1;
  Mat bottom_blob_int8;
  Mat bottom_blob_unbordered;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *in_stack_fffffffffffff7e0;
  Mat *in_stack_fffffffffffff7e8;
  int in_stack_fffffffffffff7f0;
  int in_stack_fffffffffffff7f4;
  int iVar3;
  Mat *in_stack_fffffffffffff7f8;
  Mat *in_stack_fffffffffffff800;
  undefined7 in_stack_fffffffffffff828;
  undefined1 in_stack_fffffffffffff82f;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffff830;
  undefined4 local_778;
  undefined4 uStack_774;
  pointer pfStack_770;
  undefined4 local_768;
  undefined4 uStack_764;
  undefined4 uStack_760;
  undefined4 uStack_75c;
  undefined8 local_758;
  value_type local_750;
  undefined1 local_748 [64];
  Option *in_stack_fffffffffffff8f8;
  Option *in_stack_fffffffffffff900;
  Mat *in_stack_fffffffffffff908;
  Mat *in_stack_fffffffffffff910;
  Mat *in_stack_fffffffffffff918;
  Mat *in_stack_fffffffffffff920;
  Mat *in_stack_fffffffffffff928;
  Mat *in_stack_fffffffffffff930;
  int local_6c4;
  undefined4 local_6b8;
  undefined4 uStack_6b4;
  pointer pfStack_6b0;
  undefined4 local_6a8;
  undefined4 uStack_6a4;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  undefined8 local_698;
  value_type local_688;
  undefined1 local_680 [64];
  undefined1 local_640 [68];
  int local_5fc;
  undefined4 local_5f8;
  undefined4 uStack_5f4;
  pointer pfStack_5f0;
  undefined4 local_5e8;
  undefined4 uStack_5e4;
  undefined4 uStack_5e0;
  undefined4 uStack_5dc;
  undefined8 local_5d8;
  value_type local_5d0;
  undefined1 local_5c8 [64];
  undefined1 local_588 [68];
  int local_544;
  int local_540;
  int local_53c;
  undefined4 local_538;
  undefined4 uStack_534;
  pointer pfStack_530;
  undefined4 local_528;
  undefined4 uStack_524;
  undefined4 uStack_520;
  undefined4 uStack_51c;
  undefined8 local_518;
  value_type local_508;
  undefined1 local_500 [64];
  undefined1 local_4c0 [68];
  int local_47c;
  undefined4 local_448;
  undefined4 uStack_444;
  pointer pfStack_440;
  undefined4 local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined8 local_428;
  value_type local_420;
  undefined1 local_418 [64];
  undefined1 local_3d8 [68];
  int local_394;
  int local_390;
  int local_38c;
  undefined4 local_388;
  undefined4 uStack_384;
  pointer pfStack_380;
  undefined4 local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined8 local_368;
  value_type local_360;
  undefined1 local_358 [64];
  undefined1 local_318 [68];
  int local_2d4;
  Mat local_2a0;
  int local_260;
  int local_25c;
  undefined1 local_258 [48];
  undefined1 local_228 [48];
  undefined1 local_1f8 [92];
  int local_19c;
  int local_198;
  undefined1 local_188 [64];
  undefined1 local_148 [64];
  undefined4 local_108;
  undefined4 uStack_104;
  Allocator *pAStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  int local_e0;
  int local_dc;
  int local_d8;
  Mat local_c8;
  Mat local_88;
  int local_48;
  int local_44;
  size_t local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  vector<float,_std::allocator<float>_> *local_20;
  int local_4;
  
  local_2c = in_RSI->w;
  local_30 = in_RSI->h;
  local_34 = in_RSI->c;
  local_40 = in_RSI->elemsize;
  if ((local_34 % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8) != 0) ||
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80) %
      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8) != 0)) {
    return -100;
  }
  local_44 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c) *
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84) + -1) + 1;
  local_48 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x90) *
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x88) + -1) + 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  Mat::Mat(&local_88,in_RSI);
  if (((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x20c) & 1) != 0) && (local_40 != 1))
  {
    Mat::Mat(&local_c8);
    Mat::create(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
                (int)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                (size_t)in_stack_fffffffffffff7e8,(Allocator *)in_stack_fffffffffffff7e0);
    bVar1 = Mat::empty(in_stack_fffffffffffff7e0);
    if (bVar1) {
      local_4 = -100;
      local_d8 = 1;
    }
    else {
      local_dc = local_34 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
      for (local_e0 = 0; local_e0 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
          local_e0 = local_e0 + 1) {
        local_e8 = local_28[4];
        local_f8 = local_28[2];
        uStack_f0 = local_28[3];
        _local_108 = CONCAT44(1,(int)*local_28);
        pAStack_100 = local_c8.allocator;
        Mat::channel_range(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                           in_stack_fffffffffffff7f0);
        Mat::channel_range(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                           in_stack_fffffffffffff7f0);
        ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x210),(long)local_e0);
        (*(*ppLVar2)->_vptr_Layer[7])(*ppLVar2,local_148,local_188,&local_108);
        Mat::~Mat((Mat *)0x19a720);
        Mat::~Mat((Mat *)0x19a72d);
      }
      Mat::operator=(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
      local_d8 = 0;
    }
    Mat::~Mat((Mat *)0x19a7b8);
    if (local_d8 != 0) goto LAB_0019c592;
  }
  Mat::Mat((Mat *)(local_1f8 + 0x30),&local_88);
  if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x9c) < 1) &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0) < 1)) &&
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa4) < 1)) &&
     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa8) < 1)) {
    if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x9c) == -0xe9) &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0) == -0xe9)) &&
       ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa4) == -0xe9 &&
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa8) == -0xe9)))) {
      local_228._44_4_ =
           (local_44 +
           ((local_2c + -1) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94)) *
           *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94)) - local_2c;
      local_228._40_4_ =
           (local_48 +
           ((local_30 + -1) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98)) *
           *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98)) - local_30;
      if ((0 < (int)local_228._44_4_) || (0 < (int)local_228._40_4_)) {
        local_228._32_8_ = local_28[4];
        local_228._0_8_ = *local_28;
        local_228._16_8_ = local_28[2];
        local_228._24_8_ = local_28[3];
        local_228._8_8_ = local_28[2];
        in_stack_fffffffffffff7e0 = (Mat *)local_228;
        copy_make_border((Mat *)bottom_blob_bordered_g_5.data,(Mat *)top_blob_g_3.cstep,
                         top_blob_g_3.c,top_blob_g_3.h,top_blob_g_3.w,top_blob_g_3.dims,
                         (int)bottom_blob_bordered_g_5.elemsize,top_blob_g_3.allocator._4_4_,
                         (Option *)bottom_blob_bordered_g_5._24_8_);
        bVar1 = Mat::empty(in_stack_fffffffffffff7e0);
        if (bVar1) {
          local_4 = -100;
          local_d8 = 1;
          goto LAB_0019c574;
        }
      }
      local_2c = local_19c;
      local_30 = local_198;
    }
    else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x9c) == -0xea) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa0) == -0xea)) &&
            ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa4) == -0xea &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xa8) == -0xea)))) {
      local_258._44_4_ =
           (local_44 +
           ((local_2c + -1) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94)) *
           *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94)) - local_2c;
      local_258._40_4_ =
           (local_48 +
           ((local_30 + -1) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98)) *
           *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98)) - local_30;
      if ((0 < (int)local_258._44_4_) || (0 < (int)local_258._40_4_)) {
        local_258._32_8_ = local_28[4];
        local_258._0_8_ = *local_28;
        local_258._16_8_ = local_28[2];
        local_258._24_8_ = local_28[3];
        local_258._8_8_ = local_28[2];
        in_stack_fffffffffffff7e0 = (Mat *)local_258;
        copy_make_border((Mat *)bottom_blob_bordered_g_5.data,(Mat *)top_blob_g_3.cstep,
                         top_blob_g_3.c,top_blob_g_3.h,top_blob_g_3.w,top_blob_g_3.dims,
                         (int)bottom_blob_bordered_g_5.elemsize,top_blob_g_3.allocator._4_4_,
                         (Option *)bottom_blob_bordered_g_5._24_8_);
        bVar1 = Mat::empty(in_stack_fffffffffffff7e0);
        if (bVar1) {
          local_4 = -100;
          local_d8 = 1;
          goto LAB_0019c574;
        }
      }
      local_2c = local_19c;
      local_30 = local_198;
    }
LAB_0019ae24:
    local_25c = (local_2c - local_44) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) +
                1;
    local_260 = (local_30 - local_48) / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) +
                1;
    iVar3 = (int)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x20c) & 1) == 0) {
      Mat::create(in_stack_fffffffffffff800,iVar3,(int)in_stack_fffffffffffff7f8,
                  in_stack_fffffffffffff7f4,(size_t)in_stack_fffffffffffff7e8,
                  (Allocator *)in_stack_fffffffffffff7e0);
      bVar1 = Mat::empty(in_stack_fffffffffffff7e0);
      iVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7f4);
      if (bVar1) {
        local_4 = -100;
        local_d8 = 1;
      }
      else if ((local_34 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8)) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8) ==
               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80))) {
        if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84) == 3) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x88) == 3)) &&
            (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c) == 1)) &&
           (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x90) == 1)) {
          if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) == 1) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) == 1)) {
            convdw3x3s1_sse(in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                            in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                            (Option *)in_stack_fffffffffffff910);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) == 2) &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) == 2)) {
            convdw3x3s2_sse(in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                            in_stack_fffffffffffff910,in_stack_fffffffffffff908,
                            in_stack_fffffffffffff900);
          }
          if (in_RDI[1] != 0) {
            (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
          }
          local_4 = 0;
          local_d8 = 1;
        }
        else {
          for (local_5fc = 0; local_5fc < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8)
              ; local_5fc = local_5fc + 1) {
            Mat::channel_range(in_stack_fffffffffffff7f8,iVar3,in_stack_fffffffffffff7f0);
            Mat::channel_range(in_stack_fffffffffffff7f8,iVar3,in_stack_fffffffffffff7f0);
            ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 2),(long)local_5fc);
            local_688 = *ppLVar2;
            local_698 = local_28[4];
            local_6b8 = *(undefined4 *)local_28;
            local_6a8 = *(undefined4 *)(local_28 + 2);
            uStack_6a4 = *(undefined4 *)((long)local_28 + 0x14);
            uStack_6a0 = *(undefined4 *)(local_28 + 3);
            uStack_69c = *(undefined4 *)((long)local_28 + 0x1c);
            uStack_6b4 = 1;
            pfStack_6b0 = local_20[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish;
            (*local_688->_vptr_Layer[7])(local_688,local_640,local_680,&local_6b8);
            Mat::~Mat((Mat *)0x19c298);
            Mat::~Mat((Mat *)0x19c2a5);
          }
          if (in_RDI[1] != 0) {
            (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
          }
          local_4 = 0;
          local_d8 = 1;
        }
      }
      else {
        for (local_6c4 = 0; local_6c4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
            local_6c4 = local_6c4 + 1) {
          Mat::channel_range(in_stack_fffffffffffff7f8,iVar3,in_stack_fffffffffffff7f0);
          Mat::channel_range(in_stack_fffffffffffff7f8,iVar3,in_stack_fffffffffffff7f0);
          ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2)
                               ,(long)local_6c4);
          local_750 = *ppLVar2;
          local_758 = local_28[4];
          local_778 = *(undefined4 *)local_28;
          uStack_774 = *(undefined4 *)((long)local_28 + 4);
          local_768 = *(undefined4 *)(local_28 + 2);
          uStack_764 = *(undefined4 *)((long)local_28 + 0x14);
          uStack_760 = *(undefined4 *)(local_28 + 3);
          uStack_75c = *(undefined4 *)((long)local_28 + 0x1c);
          pfStack_770 = local_20[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          (*local_750->_vptr_Layer[7])(local_750,&stack0xfffffffffffff8f8,local_748,&local_778);
          Mat::~Mat((Mat *)0x19c4bd);
          Mat::~Mat((Mat *)0x19c4ca);
        }
        if (in_RDI[1] != 0) {
          (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
        }
        local_4 = 0;
        local_d8 = 1;
      }
    }
    else if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x20d) & 1) == 0) {
      Mat::create(in_stack_fffffffffffff800,iVar3,(int)in_stack_fffffffffffff7f8,
                  in_stack_fffffffffffff7f4,(size_t)in_stack_fffffffffffff7e8,
                  (Allocator *)in_stack_fffffffffffff7e0);
      bVar1 = Mat::empty(in_stack_fffffffffffff7e0);
      if (bVar1) {
        local_4 = -100;
        local_d8 = 1;
      }
      else {
        if ((local_34 != *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8)) ||
           (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8) !=
            *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80))) {
          local_53c = local_34 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
          local_540 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80) /
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
          for (local_544 = 0; local_544 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8)
              ; local_544 = local_544 + 1) {
            Mat::channel_range(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                               in_stack_fffffffffffff7f0);
            Mat::channel_range(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                               in_stack_fffffffffffff7f0);
            ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 2),(long)local_544);
            local_5d0 = *ppLVar2;
            local_5d8 = local_28[4];
            local_5f8 = *(undefined4 *)local_28;
            uStack_5f4 = *(undefined4 *)((long)local_28 + 4);
            local_5e8 = *(undefined4 *)(local_28 + 2);
            uStack_5e4 = *(undefined4 *)((long)local_28 + 0x14);
            uStack_5e0 = *(undefined4 *)(local_28 + 3);
            uStack_5dc = *(undefined4 *)((long)local_28 + 0x1c);
            pfStack_5f0 = local_20[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish;
            (*local_5d0->_vptr_Layer[7])(local_5d0,local_588,local_5c8,&local_5f8);
            Mat::~Mat((Mat *)0x19be44);
            Mat::~Mat((Mat *)0x19be51);
          }
          goto LAB_0019beb2;
        }
        if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84) == 3) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x88) == 3)) &&
            (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c) == 1)) &&
           ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x90) == 1 &&
            (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) == 1 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) == 1)) ||
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) == 2 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) == 2)))))))) {
          if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) == 1) &&
             (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) == 1)) {
            std::vector<float,_std::allocator<float>_>::vector
                      (in_stack_fffffffffffff830,
                       (vector<float,_std::allocator<float>_> *)
                       CONCAT17(bVar1,in_stack_fffffffffffff828));
            convdw3x3s1_int8_dequant_sse
                      (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910
                       ,in_stack_fffffffffffff908,
                       (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff900,
                       in_stack_fffffffffffff8f8);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) == 2) &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) == 2)) {
            std::vector<float,_std::allocator<float>_>::vector
                      (in_stack_fffffffffffff830,
                       (vector<float,_std::allocator<float>_> *)
                       CONCAT17(bVar1,in_stack_fffffffffffff828));
            convdw3x3s2_int8_dequant_sse
                      (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910
                       ,in_stack_fffffffffffff908,
                       (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff900,
                       in_stack_fffffffffffff8f8);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)
                       CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
          }
          if (in_RDI[1] != 0) {
            (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
          }
          local_4 = 0;
          local_d8 = 1;
        }
        else {
          for (local_47c = 0; local_47c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8)
              ; local_47c = local_47c + 1) {
            Mat::channel_range(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                               in_stack_fffffffffffff7f0);
            Mat::channel_range(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                               in_stack_fffffffffffff7f0);
            ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 2),(long)local_47c);
            local_508 = *ppLVar2;
            local_518 = local_28[4];
            local_538 = *(undefined4 *)local_28;
            local_528 = *(undefined4 *)(local_28 + 2);
            uStack_524 = *(undefined4 *)((long)local_28 + 0x14);
            uStack_520 = *(undefined4 *)(local_28 + 3);
            uStack_51c = *(undefined4 *)((long)local_28 + 0x1c);
            uStack_534 = 1;
            pfStack_530 = local_20[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish;
            (*local_508->_vptr_Layer[7])(local_508,local_4c0,local_500,&local_538);
            Mat::~Mat((Mat *)0x19bc1f);
            Mat::~Mat((Mat *)0x19bc2c);
          }
          if (in_RDI[1] != 0) {
            (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
          }
          local_4 = 0;
          local_d8 = 1;
        }
      }
    }
    else {
      Mat::Mat(&local_2a0);
      Mat::create(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
                  (int)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                  (size_t)in_stack_fffffffffffff7e8,(Allocator *)in_stack_fffffffffffff7e0);
      bVar1 = Mat::empty(in_stack_fffffffffffff7e0);
      if (bVar1) {
        local_4 = -100;
        local_d8 = 1;
      }
      else {
        Mat::create(in_stack_fffffffffffff800,(int)((ulong)in_stack_fffffffffffff7f8 >> 0x20),
                    (int)in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                    (size_t)in_stack_fffffffffffff7e8,(Allocator *)in_stack_fffffffffffff7e0);
        bVar1 = Mat::empty(in_stack_fffffffffffff7e0);
        if (bVar1) {
          local_4 = -100;
          local_d8 = 1;
        }
        else if ((local_34 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8)) &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8) ==
                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80))) {
          if (((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84) == 3) &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x88) == 3)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c) == 1)) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x90) == 1)) &&
             (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) == 1)) ||
              ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) == 2 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) == 2)))))) {
            if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) == 1) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) == 1)) {
              std::vector<float,_std::allocator<float>_>::vector
                        (in_stack_fffffffffffff830,
                         (vector<float,_std::allocator<float>_> *)
                         CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828));
              convdw3x3s1_int8_requant_sse
                        (in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                         in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                         (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff910,
                         (Option *)in_stack_fffffffffffff908);
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)
                         CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
            }
            else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) == 2) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) == 2)) {
              std::vector<float,_std::allocator<float>_>::vector
                        (local_20,(vector<float,_std::allocator<float>_> *)
                                  CONCAT17(in_stack_fffffffffffff82f,in_stack_fffffffffffff828));
              convdw3x3s2_int8_requant_sse
                        (in_stack_fffffffffffff930,in_stack_fffffffffffff928,
                         in_stack_fffffffffffff920,in_stack_fffffffffffff918,
                         (vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff910,
                         (Option *)in_stack_fffffffffffff908);
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)
                         CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
            }
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
            }
            local_4 = 0;
            local_d8 = 1;
          }
          else {
            for (local_2d4 = 0;
                local_2d4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
                local_2d4 = local_2d4 + 1) {
              Mat::channel_range(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                                 in_stack_fffffffffffff7f0);
              Mat::channel_range(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                                 in_stack_fffffffffffff7f0);
              ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                  ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                   (in_RDI + 2),(long)local_2d4);
              local_360 = *ppLVar2;
              local_368 = local_28[4];
              local_388 = *(undefined4 *)local_28;
              local_378 = *(undefined4 *)(local_28 + 2);
              uStack_374 = *(undefined4 *)((long)local_28 + 0x14);
              uStack_370 = *(undefined4 *)(local_28 + 3);
              uStack_36c = *(undefined4 *)((long)local_28 + 0x1c);
              uStack_384 = 1;
              pfStack_380 = local_20[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish;
              (*local_360->_vptr_Layer[7])(local_360,local_318,local_358,&local_388);
              Mat::~Mat((Mat *)0x19b45f);
              Mat::~Mat((Mat *)0x19b46c);
            }
            if (in_RDI[1] != 0) {
              (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
            }
            local_4 = 0;
            local_d8 = 1;
          }
        }
        else {
          local_38c = local_34 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
          local_390 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80) /
                      *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
          for (local_394 = 0; local_394 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8)
              ; local_394 = local_394 + 1) {
            Mat::channel_range(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                               in_stack_fffffffffffff7f0);
            Mat::channel_range(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f4,
                               in_stack_fffffffffffff7f0);
            ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                 (in_RDI + 2),(long)local_394);
            local_420 = *ppLVar2;
            local_428 = local_28[4];
            local_448 = *(undefined4 *)local_28;
            uStack_444 = *(undefined4 *)((long)local_28 + 4);
            local_438 = *(undefined4 *)(local_28 + 2);
            uStack_434 = *(undefined4 *)((long)local_28 + 0x14);
            uStack_430 = *(undefined4 *)(local_28 + 3);
            uStack_42c = *(undefined4 *)((long)local_28 + 0x1c);
            pfStack_440 = local_20[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish;
            (*local_420->_vptr_Layer[7])(local_420,local_3d8,local_418,&local_448);
            Mat::~Mat((Mat *)0x19b684);
            Mat::~Mat((Mat *)0x19b691);
          }
          local_d8 = 0;
        }
      }
      Mat::~Mat((Mat *)0x19b705);
      if (local_d8 == 0) {
LAB_0019beb2:
        if (in_RDI[1] != 0) {
          (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
        }
        local_4 = 0;
        local_d8 = 1;
      }
    }
  }
  else {
    local_1f8._32_8_ = local_28[4];
    local_1f8._0_8_ = *local_28;
    local_1f8._16_8_ = local_28[2];
    local_1f8._24_8_ = local_28[3];
    local_1f8._8_8_ = local_28[2];
    in_stack_fffffffffffff7e0 = (Mat *)local_1f8;
    copy_make_border((Mat *)bottom_blob_bordered_g_5.data,(Mat *)top_blob_g_3.cstep,top_blob_g_3.c,
                     top_blob_g_3.h,top_blob_g_3.w,top_blob_g_3.dims,
                     (int)bottom_blob_bordered_g_5.elemsize,top_blob_g_3.allocator._4_4_,
                     (Option *)bottom_blob_bordered_g_5._24_8_);
    bVar1 = Mat::empty(in_stack_fffffffffffff7e0);
    if (!bVar1) {
      local_2c = local_19c;
      local_30 = local_198;
      goto LAB_0019ae24;
    }
    local_4 = -100;
    local_d8 = 1;
  }
LAB_0019c574:
  Mat::~Mat((Mat *)0x19c581);
LAB_0019c592:
  Mat::~Mat((Mat *)0x19c59f);
  return local_4;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        const int channels_g = channels / group;

        // quantize, scale and round to nearest
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            const Mat bottom_blob_g = bottom_blob.channel_range(channels_g * g, channels_g);
            Mat bottom_blob_int8_g = bottom_blob_int8.channel_range(channels_g * g, channels_g);
            quantize_ops[g]->forward(bottom_blob_g, bottom_blob_int8_g, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;       
    }     

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    if (use_int8_inference)
    {
        if (use_int8_requantize)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // depth-wise
            if (channels == group && group == num_output)
            {                
                if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
                {
                    if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                    {
                        if (stride_w == 1 && stride_h == 1)
                        {
                            convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);                          
                        }
                        else if (stride_w == 2 && stride_h == 2)
                        {
                            convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);                           
                        }

                        if (activation)
                        {
                            activation->forward_inplace(top_blob, opt);
                        }

                        return 0;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g=0; g<group; g++)
                {
                    const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
                    Mat top_blob_tm_g = top_blob_tm.channel_range(g, 1);

                    const ncnn::Layer* op = group_ops[g];

                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    // forward
                    op->forward(bottom_blob_bordered_g, top_blob_tm_g, opt_g);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }                

                return 0;
            }

            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
                Mat top_blob_tm_g = top_blob_tm.channel_range(num_output_g * g, num_output_g);

                const ncnn::Layer* op = group_ops[g];

                Option opt_g = opt;
                opt_g.blob_allocator = top_blob.allocator;

                // forward
                op->forward(bottom_blob_bordered_g, top_blob_tm_g, opt_g);
            }                 
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            // depth-wise
            if (channels == group && group == num_output)
            {                
                if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
                {
                    if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
                    {
                        if (stride_w == 1 && stride_h == 1)
                        {
                            convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                        }
                        else if (stride_w == 2 && stride_h == 2)
                        {
                            convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);                          
                        }

                        if (activation)
                        {
                            activation->forward_inplace(top_blob, opt);
                        }                        

                        return 0;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g=0; g<group; g++)
                {
                    const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
                    Mat top_blob_g = top_blob.channel_range(g, 1);

                    const ncnn::Layer* op = group_ops[g];

                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    // forward
                    op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }                
              
                return 0;
            }

            const int channels_g = channels / group;
            const int num_output_g = num_output / group;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int g=0; g<group; g++)
            {
                const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
                Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

                const ncnn::Layer* op = group_ops[g];

                Option opt_g = opt;
                opt_g.blob_allocator = top_blob.allocator;

                // forward
                op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
            }                       
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }          

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;
    
    // depth-wise
    if (channels == group && group == num_output)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
        {
            if (stride_w == 1 && stride_h == 1)
            {
                convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
            }
            else if (stride_w == 2 && stride_h == 2)
            {
                convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }

            return 0;
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g=0; g<group; g++)
        {
            const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(g, 1);
            Mat top_blob_g = top_blob.channel_range(g, 1);

            const ncnn::Layer* op = group_ops[g];

            Option opt_g = opt;
            opt_g.num_threads = 1;
            opt_g.blob_allocator = top_blob.allocator;

         // forward
            op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }

        return 0;
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}